

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::DecimalFormat::getAttribute
          (DecimalFormat *this,UNumberFormatAttribute attr,UErrorCode *status)

{
  DecimalFormatProperties *pDVar1;
  char cVar2;
  UCurrencyUsage UVar3;
  int iVar4;
  int32_t iVar5;
  UCurrencyUsage UVar6;
  
  if (U_ZERO_ERROR < *status) {
    return -1;
  }
  switch(attr) {
  case UNUM_PARSE_INT_ONLY:
    UVar3 = (int)(this->super_NumberFormat).fParseIntegerOnly;
    break;
  case UNUM_GROUPING_USED:
    cVar2 = NumberFormat::isGroupingUsed(&this->super_NumberFormat);
    goto LAB_0024d11e;
  case UNUM_DECIMAL_ALWAYS_SHOWN:
    UVar3 = (uint)((this->fields->properties).
                   super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                  decimalSeparatorAlwaysShown;
    break;
  case UNUM_MAX_INTEGER_DIGITS:
    iVar5 = NumberFormat::getMaximumIntegerDigits(&this->super_NumberFormat);
    return iVar5;
  case UNUM_MIN_INTEGER_DIGITS:
  case UNUM_INTEGER_DIGITS:
    iVar5 = NumberFormat::getMinimumIntegerDigits(&this->super_NumberFormat);
    return iVar5;
  case UNUM_MAX_FRACTION_DIGITS:
    iVar5 = NumberFormat::getMaximumFractionDigits(&this->super_NumberFormat);
    return iVar5;
  case UNUM_MIN_FRACTION_DIGITS:
  case UNUM_FRACTION_DIGITS:
    iVar5 = NumberFormat::getMinimumFractionDigits(&this->super_NumberFormat);
    return iVar5;
  case UNUM_MULTIPLIER:
    iVar5 = getMultiplier(this);
    return iVar5;
  case UNUM_GROUPING_SIZE:
    UVar6 = ((this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
            groupingSize;
    goto LAB_0024d061;
  case UNUM_ROUNDING_MODE:
    iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x22])();
    return iVar4;
  case UNUM_ROUNDING_INCREMENT:
  case UNUM_PARSE_ALL_INPUT:
switchD_0024cf8c_caseD_c:
    *status = U_UNSUPPORTED_ERROR;
    UVar3 = ~UCURR_USAGE_STANDARD;
    break;
  case UNUM_FORMAT_WIDTH:
    iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x36])();
    return iVar4;
  case UNUM_PADDING_POSITION:
    iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x3a])();
    return iVar4;
  case UNUM_SECONDARY_GROUPING_SIZE:
    UVar6 = ((this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
            secondaryGroupingSize;
LAB_0024d061:
    UVar3 = UCURR_USAGE_STANDARD;
    if (0 < (int)UVar6) {
      UVar3 = UVar6;
    }
    break;
  case UNUM_SIGNIFICANT_DIGITS_USED:
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    UVar3 = UCURR_USAGE_CASH;
    if (pDVar1->minimumSignificantDigits == -1) {
      UVar3 = (uint)(pDVar1->maximumSignificantDigits != -1);
    }
    break;
  case UNUM_MIN_SIGNIFICANT_DIGITS:
    UVar3 = ((this->fields->exportedProperties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
            minimumSignificantDigits;
    break;
  case UNUM_MAX_SIGNIFICANT_DIGITS:
    UVar3 = ((this->fields->exportedProperties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
            maximumSignificantDigits;
    break;
  case UNUM_LENIENT_PARSE:
    iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])();
    cVar2 = (char)iVar4;
    goto LAB_0024d11e;
  case UNUM_SCALE:
    UVar3 = ((this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
            multiplierScale;
    break;
  case UNUM_MINIMUM_GROUPING_DIGITS:
    UVar3 = ((this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
            minimumGroupingDigits;
    break;
  case UNUM_CURRENCY_USAGE:
    pDVar1 = (this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
    UVar3 = UCURR_USAGE_STANDARD;
    if ((pDVar1->currencyUsage).fNull == false) {
      UVar3 = (pDVar1->currencyUsage).fValue;
    }
    break;
  default:
    switch(attr) {
    case UNUM_FORMAT_FAIL_IF_MORE_THAN_MAX_DIGITS:
      iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x4b])();
      cVar2 = (char)iVar4;
      break;
    case UNUM_PARSE_NO_EXPONENT:
      iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x47])();
      cVar2 = (char)iVar4;
      break;
    case UNUM_PARSE_DECIMAL_MARK_REQUIRED:
      return (uint)((this->fields->properties).
                    super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                   decimalPatternMatchRequired;
    default:
      goto switchD_0024cf8c_caseD_c;
    case UNUM_PARSE_CASE_SENSITIVE:
      iVar4 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x49])();
      cVar2 = (char)iVar4;
      break;
    case UNUM_SIGN_ALWAYS_SHOWN:
      return (uint)((this->fields->properties).
                    super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                   signAlwaysShown;
    }
LAB_0024d11e:
    UVar3 = (int)cVar2;
  }
  return UVar3;
}

Assistant:

int32_t DecimalFormat::getAttribute(UNumberFormatAttribute attr, UErrorCode& status) const {
    if (U_FAILURE(status)) { return -1; }
    switch (attr) {
        case UNUM_LENIENT_PARSE:
            return isLenient();

        case UNUM_PARSE_INT_ONLY:
            return isParseIntegerOnly();

        case UNUM_GROUPING_USED:
            return isGroupingUsed();

        case UNUM_DECIMAL_ALWAYS_SHOWN:
            return isDecimalSeparatorAlwaysShown();

        case UNUM_MAX_INTEGER_DIGITS:
            return getMaximumIntegerDigits();

        case UNUM_MIN_INTEGER_DIGITS:
            return getMinimumIntegerDigits();

        case UNUM_INTEGER_DIGITS:
            // TBD: what should this return?
            return getMinimumIntegerDigits();

        case UNUM_MAX_FRACTION_DIGITS:
            return getMaximumFractionDigits();

        case UNUM_MIN_FRACTION_DIGITS:
            return getMinimumFractionDigits();

        case UNUM_FRACTION_DIGITS:
            // TBD: what should this return?
            return getMinimumFractionDigits();

        case UNUM_SIGNIFICANT_DIGITS_USED:
            return areSignificantDigitsUsed();

        case UNUM_MAX_SIGNIFICANT_DIGITS:
            return getMaximumSignificantDigits();

        case UNUM_MIN_SIGNIFICANT_DIGITS:
            return getMinimumSignificantDigits();

        case UNUM_MULTIPLIER:
            return getMultiplier();

        case UNUM_SCALE:
            return getMultiplierScale();

        case UNUM_GROUPING_SIZE:
            return getGroupingSize();

        case UNUM_ROUNDING_MODE:
            return getRoundingMode();

        case UNUM_FORMAT_WIDTH:
            return getFormatWidth();

        case UNUM_PADDING_POSITION:
            return getPadPosition();

        case UNUM_SECONDARY_GROUPING_SIZE:
            return getSecondaryGroupingSize();

        case UNUM_PARSE_NO_EXPONENT:
            return isParseNoExponent();

        case UNUM_PARSE_DECIMAL_MARK_REQUIRED:
            return isDecimalPatternMatchRequired();

        case UNUM_CURRENCY_USAGE:
            return getCurrencyUsage();

        case UNUM_MINIMUM_GROUPING_DIGITS:
            return getMinimumGroupingDigits();

        case UNUM_PARSE_CASE_SENSITIVE:
            return isParseCaseSensitive();

        case UNUM_SIGN_ALWAYS_SHOWN:
            return isSignAlwaysShown();

        case UNUM_FORMAT_FAIL_IF_MORE_THAN_MAX_DIGITS:
            return isFormatFailIfMoreThanMaxDigits();

        default:
            status = U_UNSUPPORTED_ERROR;
            break;
    }

    return -1; /* undefined */
}